

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtSphereCylinderCollisionAlgorithm::processCollision
          (cbtSphereCylinderCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtCollisionShape *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtPersistentManifold *this_00;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  cbtCollisionObjectWrapper *pcVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [64];
  cbtVector3 normalOnSurfaceB;
  cbtVector3 pos1;
  undefined1 local_70 [8];
  float fStack_68;
  float local_5c;
  undefined1 local_58 [8];
  float fStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (this->m_manifoldPtr == (cbtPersistentManifold *)0x0) {
    return;
  }
  pcVar8 = body1;
  if (this->m_isSwapped != false) {
    pcVar8 = body0;
    body0 = body1;
  }
  resultOut->m_manifoldPtr = this->m_manifoldPtr;
  pcVar1 = pcVar8->m_shape;
  pcVar2 = pcVar8->m_collisionObject;
  pcVar3 = body0->m_collisionObject;
  fVar10 = (pcVar3->m_worldTransform).m_origin.m_floats[0] -
           (pcVar2->m_worldTransform).m_origin.m_floats[0];
  fVar13 = (pcVar3->m_worldTransform).m_origin.m_floats[1] -
           (pcVar2->m_worldTransform).m_origin.m_floats[1];
  fVar5 = (pcVar3->m_worldTransform).m_origin.m_floats[2] -
          (pcVar2->m_worldTransform).m_origin.m_floats[2];
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                    m_floats[0])),ZEXT416((uint)fVar10),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[0]));
  fVar18 = auVar20._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                    m_floats[1])),ZEXT416((uint)fVar10),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[1]));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[1]));
  fVar11 = auVar20._0_4_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                    m_floats[2])),ZEXT416((uint)fVar10),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2]));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2]));
  fVar13 = auVar20._0_4_;
  fVar5 = *(float *)&body0->m_shape[1].field_0xc * *(float *)&body0->m_shape->field_0x1c;
  fVar10 = *(float *)&pcVar1[1].field_0xc;
  local_38._0_4_ = fVar10;
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  local_5c = fVar10;
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  uVar12 = *(ulong *)&pcVar1[1].field_0xc;
  local_48._8_8_ = 0;
  local_48._0_8_ = uVar12;
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  fVar10 = (float)uVar12;
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  (*pcVar1->_vptr_cbtCollisionShape[0xc])(pcVar1);
  auVar20 = vmovshdup_avx(local_48);
  fVar10 = auVar20._0_4_ + fVar10;
  auVar25 = ZEXT464((uint)fVar10);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),ZEXT816(0) << 0x20);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
  fVar15 = auVar20._0_4_;
  if (fVar15 < 0.0) {
    local_48 = ZEXT416((uint)fVar10);
    fVar10 = sqrtf(fVar15);
    auVar20 = ZEXT416((uint)fVar15);
    auVar25 = ZEXT1664(local_48);
  }
  else {
    auVar9 = vsqrtss_avx(auVar20,auVar20);
    fVar10 = auVar9._0_4_;
  }
  fVar15 = local_5c + (float)local_38._0_4_;
  _local_70 = SUB6416(ZEXT464(0x3f800000),0);
  fVar24 = auVar25._0_4_;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(auVar25._0_16_,auVar9);
  if ((fVar24 < fVar11) || (fVar11 < auVar9._0_4_)) {
    uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar9,1);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar16 = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * 0x3f800000);
    if (fVar10 <= fVar15) {
      auVar14 = ZEXT816(0) << 0x20;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (pcVar2->m_worldTransform).m_basis.m_el[0].
                                                        m_floats[1])),auVar14,
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar17 = ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2]);
      auVar20 = vfmadd231ss_fma(auVar20,auVar17,auVar14);
      fVar10 = (pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[1];
      auVar19 = ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[0]);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar10)),auVar19,auVar14);
      auVar22 = ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2]);
      auVar9 = vfmadd231ss_fma(auVar9,auVar22,auVar14);
      auVar20 = vinsertps_avx(auVar20,auVar9,0x10);
      fVar15 = (pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[1];
      auVar21 = ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[0]);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar15)),auVar21,auVar14);
      auVar23 = ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2]);
      auVar9 = vfmadd231ss_fma(auVar9,auVar23,auVar14);
      _local_70 = vinsertps_avx(auVar20,auVar9,0x28);
      fVar18 = fVar18 + 0.0;
      fVar4 = fVar24 * fVar16 + 0.0;
      fVar13 = fVar13 + 0.0;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (pcVar2->m_worldTransform).m_basis.m_el[0].
                                                       m_floats[1])),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar13),auVar17);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar10)),ZEXT416((uint)fVar18),auVar19);
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar13),auVar22);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar15)),ZEXT416((uint)fVar18),auVar21);
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar13),auVar23);
      auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ +
                                            (pcVar2->m_worldTransform).m_origin.m_floats[0])),
                              ZEXT416((uint)(auVar9._0_4_ +
                                            (pcVar2->m_worldTransform).m_origin.m_floats[1])),0x10);
      _local_58 = vinsertps_avx(auVar20,ZEXT416((uint)(auVar14._0_4_ +
                                                      (pcVar2->m_worldTransform).m_origin.m_floats
                                                      [2])),0x28);
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)(fVar11 - fVar24)),ZEXT416((uint)fVar16),
                                ZEXT416((uint)fVar5));
      uVar12 = auVar20._0_8_;
    }
    else {
      if (auVar20._0_4_ < 0.0) {
        local_48 = auVar25._0_16_;
        local_38 = ZEXT416((uint)fVar16);
        fVar10 = sqrtf(auVar20._0_4_);
        auVar25 = ZEXT1664(local_48);
        fVar16 = (float)local_38._0_4_;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar10 = auVar20._0_4_;
      }
      fVar10 = 1.0 / fVar10;
      fVar11 = auVar25._0_4_ * fVar16 + fVar15 * fVar10 * 0.0;
      fVar18 = fVar15 * fVar10 * fVar18 + 0.0;
      fVar10 = fVar15 * fVar10 * fVar13 + 0.0;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[0].
                                                        m_floats[1])),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar10),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2]
                                       ));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                       m_floats[1])),ZEXT416((uint)fVar18),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[0])
                              );
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar10),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2])
                              );
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[2].
                                                        m_floats[1])),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[0]
                                       ));
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar10),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2]
                                       ));
      auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ +
                                            (pcVar2->m_worldTransform).m_origin.m_floats[0])),
                              ZEXT416((uint)(auVar9._0_4_ +
                                            (pcVar2->m_worldTransform).m_origin.m_floats[1])),0x10);
      _local_58 = vinsertps_avx(auVar20,ZEXT416((uint)(auVar14._0_4_ +
                                                      (pcVar2->m_worldTransform).m_origin.m_floats
                                                      [2])),0x28);
      pcVar2 = body0->m_collisionObject;
      fVar10 = (pcVar2->m_worldTransform).m_origin.m_floats[0] - (float)local_58._0_4_;
      fVar18 = (pcVar2->m_worldTransform).m_origin.m_floats[1] - (float)local_58._4_4_;
      fVar13 = (pcVar2->m_worldTransform).m_origin.m_floats[2] - fStack_50;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),ZEXT416((uint)fVar10),
                                ZEXT416((uint)fVar10));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
      fVar15 = auVar20._0_4_;
      if (fVar15 < 0.0) {
        local_38._0_4_ = fVar13;
        fVar11 = sqrtf(fVar15);
        auVar20 = ZEXT416((uint)fVar15);
        fVar13 = (float)local_38._0_4_;
      }
      else {
        auVar9 = vsqrtss_avx(auVar20,auVar20);
        fVar11 = auVar9._0_4_;
      }
      fVar11 = 1.0 / fVar11;
      auVar9 = vinsertps_avx(ZEXT416((uint)(fVar10 * fVar11)),ZEXT416((uint)(fVar18 * fVar11)),0x10)
      ;
      _local_70 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar13 * fVar11)),0x28);
      if (auVar20._0_4_ < 0.0) {
        fVar10 = sqrtf(auVar20._0_4_);
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar10 = auVar20._0_4_;
      }
      uVar12 = (ulong)(uint)(fVar10 - fVar5);
    }
  }
  else {
    if (fVar15 + fVar5 < fVar10) goto LAB_0080776d;
    if (1.1920929e-07 < fVar10) {
      fVar16 = 1.0 / fVar10;
      fVar18 = fVar16 * fVar18;
      fVar24 = fVar16 * 0.0;
      fVar16 = fVar16 * fVar13;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (pcVar2->m_worldTransform).m_basis.m_el[0].
                                                        m_floats[1])),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]
                                       ));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar16),
                                ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2]
                                       ));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                       m_floats[1])),ZEXT416((uint)fVar18),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[0])
                              );
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar16),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2])
                              );
      auVar20 = vinsertps_avx(auVar20,auVar9,0x10);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (pcVar2->m_worldTransform).m_basis.m_el[2].
                                                       m_floats[1])),ZEXT416((uint)fVar18),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[0])
                              );
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar16),
                               ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2])
                              );
      _local_70 = vinsertps_avx(auVar20,auVar9,0x28);
    }
    uVar12 = (ulong)(uint)(fVar10 - (fVar15 + fVar5));
    auVar17 = ZEXT816(0) << 0x40;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[0].
                                                      m_floats[1])),auVar17,
                              ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[0]))
    ;
    auVar20 = vfmadd231ss_fma(auVar20,auVar17,
                              ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[0].m_floats[2]))
    ;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[1])),auVar17,
                             ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[0]));
    auVar9 = vfmadd231ss_fma(auVar9,auVar17,
                             ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[1].m_floats[2]));
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * (pcVar2->m_worldTransform).m_basis.m_el[2].
                                                      m_floats[1])),auVar17,
                              ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[0]))
    ;
    auVar14 = vfmadd231ss_fma(auVar14,auVar17,
                              ZEXT416((uint)(pcVar2->m_worldTransform).m_basis.m_el[2].m_floats[2]))
    ;
    auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ +
                                           (pcVar2->m_worldTransform).m_origin.m_floats[0] +
                                          fVar15 * (float)local_70._0_4_)),
                            ZEXT416((uint)(auVar9._0_4_ +
                                           (pcVar2->m_worldTransform).m_origin.m_floats[1] +
                                          fVar15 * (float)local_70._4_4_)),0x10);
    _local_58 = vinsertps_avx(auVar20,ZEXT416((uint)(auVar14._0_4_ +
                                                     (pcVar2->m_worldTransform).m_origin.m_floats[2]
                                                    + fVar15 * fStack_68)),0x28);
  }
  (*(resultOut->super_Result)._vptr_Result[4])(uVar12,resultOut,local_70,local_58);
LAB_0080776d:
  this_00 = resultOut->m_manifoldPtr;
  if (this_00->m_cachedPoints != 0) {
    pcVar2 = resultOut->m_body0Wrap->m_collisionObject;
    if (this_00->m_body0 == pcVar2) {
      pcVar3 = resultOut->m_body1Wrap->m_collisionObject;
    }
    else {
      pcVar3 = pcVar2;
      pcVar2 = resultOut->m_body1Wrap->m_collisionObject;
    }
    cbtPersistentManifold::refreshContactPoints
              (this_00,&pcVar2->m_worldTransform,&pcVar3->m_worldTransform);
  }
  return;
}

Assistant:

void cbtSphereCylinderCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                           const cbtCollisionObjectWrapper* body1,
                                                           const cbtDispatcherInfo& dispatchInfo,
                                                           cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* sphereObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtSphereShape* sphere0 = (cbtSphereShape*)sphereObjWrap->getCollisionShape();
    const cbtCylinderShape* cylinder = (cbtCylinderShape*)cylObjWrap->getCollisionShape();

    const cbtTransform& m44T = cylObjWrap->getCollisionObject()->getWorldTransform();
    cbtVector3 diff = m44T.invXform(
        sphereObjWrap->getCollisionObject()
            ->getWorldTransform()
            .getOrigin());  // col0->getWorldTransform().getOrigin()-  col1->getWorldTransform().getOrigin();
    cbtScalar radius0 = sphere0->getRadius();
    cbtScalar radius1 = cylinder->getHalfExtentsWithMargin().getX();  // cylinder->getRadius();
    cbtScalar H1 = cylinder->getHalfExtentsWithMargin().getY();

    cbtVector3 r1 = diff;
    r1.setY(0);

    cbtScalar y1 = diff.y();

    cbtScalar r1_len = r1.length();

    cbtVector3 pos1;
    cbtVector3 normalOnSurfaceB(1, 0, 0);
    cbtScalar dist;

    // Case A
    if ((y1 <= H1) && (y1 >= -H1)) {
        /// iff distance positive, don't generate a new contact
        if (r1_len > (radius0 + radius1)) {
            resultOut->refreshContactPoints();
            return;
        }
        /// distance (negative means penetration)
        dist = r1_len - (radius0 + radius1);

        cbtVector3 localnormalOnSurfaceB;
        if (r1_len > SIMD_EPSILON) {
            localnormalOnSurfaceB = r1 / r1_len;
            normalOnSurfaceB = m44T.getBasis() * localnormalOnSurfaceB;
        }
        /// point on B (worldspace)
        pos1 = m44T(cbtVector3(0, y1, 0)) + radius1 * normalOnSurfaceB;
    } else {
        cbtScalar side = 1;
        if (y1 < -H1)
            side = -1;

        if (r1_len > radius1) {
            // case B
            cbtVector3 pos_loc = r1.normalized() * radius1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            cbtVector3 d = sphereObjWrap->getCollisionObject()->getWorldTransform().getOrigin() - pos1;
            normalOnSurfaceB = d.normalized();
            dist = d.length() - radius0;
        } else {
            // case C
            normalOnSurfaceB = m44T.getBasis() * cbtVector3(0, 1 * side, 0);
            cbtVector3 pos_loc = r1 + cbtVector3(0, H1 * side, 0);
            pos1 = m44T(pos_loc);
            dist = side * (y1 - H1) - radius0;
        }
    }
    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normalOnSurfaceB, pos1, dist);

    resultOut->refreshContactPoints();
}